

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedMS<tcu::Vector<unsigned_int,_4>,_1>::Run
          (AdvancedMS<tcu::Vector<unsigned_int,_4>,_1> *this)

{
  GLuint GVar1;
  int target_00;
  bool bVar2;
  GLenum GVar3;
  GLenum GVar4;
  GLenum GVar5;
  GLenum GVar6;
  undefined1 local_e8 [8];
  ivec4 res [7];
  undefined1 local_70 [8];
  ImageSizeMachine machine;
  GLenum GStack_28;
  int i;
  GLenum target [4];
  AdvancedMS<tcu::Vector<unsigned_int,_4>,_1> *this_local;
  
  target._8_8_ = this;
  bVar2 = ShaderImageSizeBase::SupportedInStage(&this->super_ShaderImageSizeBase,1,5);
  if (bVar2) {
    bVar2 = ShaderImageSizeBase::SupportedSamples(&this->super_ShaderImageSizeBase,4);
    if (bVar2) {
      _GStack_28 = 0x8c1800000de0;
      target[0] = 0x9102;
      target[1] = 0x9102;
      for (machine.m_texture = 0; (int)machine.m_texture < 4;
          machine.m_texture = machine.m_texture + 1) {
        glu::CallLogWrapper::glBindTexture
                  (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,(&GStack_28)[(int)machine.m_texture],
                   this->m_texture[(int)machine.m_texture]);
        if (((&GStack_28)[(int)machine.m_texture] == 0xde0) ||
           ((&GStack_28)[(int)machine.m_texture] == 0x8c18)) {
          glu::CallLogWrapper::glTexParameteri
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,(&GStack_28)[(int)machine.m_texture],0x2801,0x2600);
          glu::CallLogWrapper::glTexParameteri
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,(&GStack_28)[(int)machine.m_texture],0x2800,0x2600);
        }
        if (machine.m_texture == 0) {
          GVar6 = GStack_28;
          GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          GVar4 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
          GVar5 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage1D
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar6,0,GVar3,7,0,GVar4,GVar5,(void *)0x0);
          GVar6 = (&GStack_28)[(int)machine.m_texture];
          GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          GVar4 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
          GVar5 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage1D
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar6,1,GVar3,3,0,GVar4,GVar5,(void *)0x0);
          GVar6 = (&GStack_28)[(int)machine.m_texture];
          GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          GVar4 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
          GVar5 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage1D
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar6,2,GVar3,1,0,GVar4,GVar5,(void *)0x0);
          GVar1 = this->m_texture[(int)machine.m_texture];
          GVar6 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glBindImageTexture
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,1,GVar1,1,'\0',0,35000,GVar6);
        }
        else if (machine.m_texture == 1) {
          target_00 = i;
          GVar6 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          GVar3 = gl4cts::(anonymous_namespace)::TexFormat<tcu::Vector<unsigned_int,4>>();
          GVar4 = gl4cts::(anonymous_namespace)::TexType<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage2D
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,target_00,0,GVar6,7,0xf,0,GVar3,GVar4,(void *)0x0);
          GVar1 = this->m_texture[(int)machine.m_texture];
          GVar6 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glBindImageTexture
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,2,GVar1,0,'\x01',0,35000,GVar6);
        }
        else if (machine.m_texture == 2) {
          GVar6 = target[0];
          GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage3DMultisample
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar6,4,GVar3,7,9,3,'\0');
          GVar1 = this->m_texture[(int)machine.m_texture];
          GVar6 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glBindImageTexture
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,3,GVar1,0,'\0',1,0x88ba,GVar6);
        }
        else if (machine.m_texture == 3) {
          GVar6 = target[1];
          GVar3 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glTexImage3DMultisample
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar6,4,GVar3,0x40,0x20,5,'\0');
          GVar1 = this->m_texture[(int)machine.m_texture];
          GVar6 = gl4cts::(anonymous_namespace)::TexInternalFormat<tcu::Vector<unsigned_int,4>>();
          glu::CallLogWrapper::glBindImageTexture
                    (&(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,4,GVar1,0,'\x01',0,35000,GVar6);
        }
      }
      ImageSizeMachine::ImageSizeMachine((ImageSizeMachine *)local_70);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_e8,3,0,0,0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[0].m_data + 2),7,0xf,0,0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[1].m_data + 2),7,9,0,0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[2].m_data + 2),0x40,0x20,5,0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[3].m_data + 2),0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[4].m_data + 2),0);
      tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(res[5].m_data + 2),0);
      this_local = (AdvancedMS<tcu::Vector<unsigned_int,_4>,_1> *)
                   gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<unsigned_int,4>>
                             ((ImageSizeMachine *)local_70,1,true,(ivec4 *)local_e8,true);
      ImageSizeMachine::~ImageSizeMachine((ImageSizeMachine *)local_70);
    }
    else {
      this_local = (AdvancedMS<tcu::Vector<unsigned_int,_4>,_1> *)0x10;
    }
  }
  else {
    this_local = (AdvancedMS<tcu::Vector<unsigned_int,_4>,_1> *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInStage(STAGE, 5))
			return NOT_SUPPORTED;
		if (!SupportedSamples(4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_1D, GL_TEXTURE_1D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
								   GL_TEXTURE_2D_MULTISAMPLE_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			if (target[i] == GL_TEXTURE_1D || target[i] == GL_TEXTURE_1D_ARRAY)
			{
				glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			}

			if (i == 0)
			{
				glTexImage1D(target[i], 0, TexInternalFormat<T>(), 7, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 1, TexInternalFormat<T>(), 3, 0, TexFormat<T>(), TexType<T>(), NULL);
				glTexImage1D(target[i], 2, TexInternalFormat<T>(), 1, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(1, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexImage2D(target[i], 0, TexInternalFormat<T>(), 7, 15, 0, TexFormat<T>(), TexType<T>(), NULL);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 7, 9, 3, GL_FALSE);
				glBindImageTexture(3, m_texture[i], 0, GL_FALSE, 1, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexImage3DMultisample(target[i], 4, TexInternalFormat<T>(), 64, 32, 5, GL_FALSE);
				glBindImageTexture(4, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[7] = { ivec4(3, 0, 0, 0), ivec4(7, 15, 0, 0), ivec4(7, 9, 0, 0), ivec4(64, 32, 5, 0),
						 ivec4(0),			ivec4(0),			ivec4(0) };
		return machine.Run<T>(STAGE, true, res, true);
	}